

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSimMv.c
# Opt level: O2

int Saig_MvCreateObj(Saig_MvMan_t *p,int iFan0,int iFan1)

{
  int iVar1;
  Saig_MvAnd_t *pSVar2;
  uchar *puVar3;
  byte bVar4;
  size_t __size;
  
  iVar1 = p->nObjs;
  if (iVar1 == p->nObjsAlloc) {
    if (p->pAigNew == (Saig_MvAnd_t *)0x0) {
      pSVar2 = (Saig_MvAnd_t *)malloc((long)iVar1 * 0x18);
    }
    else {
      pSVar2 = (Saig_MvAnd_t *)realloc(p->pAigNew,(long)iVar1 * 0x18);
    }
    p->pAigNew = pSVar2;
    __size = (long)p->nObjsAlloc * 2;
    if (p->pLevels == (uchar *)0x0) {
      puVar3 = (uchar *)malloc(__size);
    }
    else {
      puVar3 = (uchar *)realloc(p->pLevels,__size);
      __size = (size_t)(uint)(p->nObjsAlloc * 2);
    }
    p->pLevels = puVar3;
    p->nObjsAlloc = (int)__size;
    iVar1 = p->nObjs;
  }
  pSVar2 = p->pAigNew;
  pSVar2[iVar1].iFan0 = iFan0;
  pSVar2[iVar1].iFan1 = iFan1;
  pSVar2[iVar1].iNext = 0;
  puVar3 = p->pLevels;
  if (iFan1 == 0 && iFan0 == 0) {
    puVar3[iVar1] = '\0';
    p->nPis = p->nPis + 1;
  }
  else {
    bVar4 = puVar3[iFan1 >> 1];
    if (puVar3[iFan1 >> 1] < puVar3[iFan0 >> 1]) {
      bVar4 = puVar3[iFan0 >> 1];
    }
    puVar3[iVar1] = bVar4 + 1;
  }
  iVar1 = p->nObjs;
  p->nObjs = iVar1 + 1;
  return iVar1;
}

Assistant:

static inline int Saig_MvCreateObj( Saig_MvMan_t * p, int iFan0, int iFan1 )
{
    Saig_MvAnd_t * pNode;
    if ( p->nObjs == p->nObjsAlloc )
    {
        p->pAigNew = ABC_REALLOC( Saig_MvAnd_t, p->pAigNew, 2*p->nObjsAlloc );
        p->pLevels = ABC_REALLOC( unsigned char, p->pLevels, 2*p->nObjsAlloc );
        p->nObjsAlloc *= 2;
    }
    pNode = p->pAigNew + p->nObjs;
    pNode->iFan0 = iFan0;
    pNode->iFan1 = iFan1;
    pNode->iNext = 0;
    if ( iFan0 || iFan1 )
        p->pLevels[p->nObjs] = 1 + Abc_MaxInt( Saig_MvLev(p, iFan0), Saig_MvLev(p, iFan1) );
    else
        p->pLevels[p->nObjs] = 0, p->nPis++;
    return p->nObjs++;
}